

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * validateEmbeddingWeightsBias
                   (Result *__return_storage_ptr__,NeuralNetworkLayer *layer,WeightParams *weights,
                   WeightParams *bias)

{
  ConvolutionLayerParams *pCVar1;
  void *pvVar2;
  bool bVar3;
  WeightParamType WVar4;
  WeightParamType WVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  byte bVar7;
  uint64_t local_c0;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string layer_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  layer_type._M_dataplus._M_p = (pointer)&layer_type.field_2;
  layer_type._M_string_length = 0;
  layer_type.field_2._M_local_buf[0] = '\0';
  if (layer->_oneof_case_[0] == 0x96) {
    pCVar1 = (layer->layer_).convolution_;
    lVar6 = *(long *)&pCVar1->_kernelsize_cached_byte_size_;
    local_c0._0_4_ = (pCVar1->stride_).current_size_;
    local_c0._4_4_ = (pCVar1->stride_).total_size_;
    bVar7 = *(byte *)&(pCVar1->stride_).arena_or_elements_;
    std::__cxx11::string::assign((char *)&layer_type);
  }
  else {
    if (layer->_oneof_case_[0] != 0x410) {
      CoreML::Result::Result(__return_storage_ptr__);
      goto LAB_002aa78f;
    }
    pCVar1 = (layer->layer_).convolution_;
    lVar6 = *(long *)&pCVar1->_kernelsize_cached_byte_size_;
    local_c0._0_4_ = (pCVar1->stride_).current_size_;
    local_c0._4_4_ = (pCVar1->stride_).total_size_;
    bVar7 = *(byte *)&(pCVar1->stride_).arena_or_elements_;
    std::__cxx11::string::assign((char *)&layer_type);
  }
  WVar4 = CoreML::valueType(weights);
  WVar5 = CoreML::valueType(bias);
  if ((WVar4 == UNSPECIFIED) || ((WVar5 == UNSPECIFIED & bVar7) != 0)) {
    std::operator+(&local_50,&layer_type," \'");
    std::operator+(&local_90,&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::operator+(&err,&local_90,
                   "\' has invalid weights/bias fields. Field value types should match and should either be half or full precision."
                  );
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    this = &err;
  }
  else {
    if ((bVar7 == 0) ||
       ((WVar4 != FLOAT16 || WVar5 != FLOAT32 && (WVar4 != FLOAT32 || WVar5 != FLOAT16)))) {
      pvVar2 = (layer->name_).tagged_ptr_.ptr_;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&err,"weight",(allocator<char> *)&local_90);
      CoreML::validateGeneralWeightParams
                (__return_storage_ptr__,weights,lVar6 * local_c0,local_c0,&layer_type,
                 (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&err);
      std::__cxx11::string::~string((string *)&err);
      bVar3 = CoreML::Result::good(__return_storage_ptr__);
      if (bVar3) {
        std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
        if (bVar7 != 0) {
          pvVar2 = (layer->name_).tagged_ptr_.ptr_;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err,"bias",(allocator<char> *)&local_90);
          CoreML::validateGeneralWeightParams
                    (__return_storage_ptr__,bias,local_c0,1,&layer_type,
                     (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&err);
          std::__cxx11::string::~string((string *)&err);
          bVar3 = CoreML::Result::good(__return_storage_ptr__);
          if (!bVar3) goto LAB_002aa78f;
          std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
        }
        CoreML::Result::Result(__return_storage_ptr__);
      }
      goto LAB_002aa78f;
    }
    std::operator+(&local_50,&layer_type," layer \'");
    std::operator+(&local_90,&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::operator+(&err,&local_90,
                   "has unmatched precisions of weights/bias They should either be half or full precision."
                  );
    CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    std::__cxx11::string::~string((string *)&err);
    std::__cxx11::string::~string((string *)&local_90);
    this = &local_50;
  }
  std::__cxx11::string::~string((string *)this);
LAB_002aa78f:
  std::__cxx11::string::~string((string *)&layer_type);
  return __return_storage_ptr__;
}

Assistant:

static Result validateEmbeddingWeightsBias(const Specification::NeuralNetworkLayer& layer,
                                              const Specification::WeightParams& weights,
                                              const Specification::WeightParams& bias) {
    bool has_bias;
    uint64_t input_dim;
    uint64_t output_channels;
    std::string layer_type;

    switch(layer.layer_case()) {
        case Specification::NeuralNetworkLayer::LayerCase::kEmbedding: {
            const auto& params = layer.embedding();
            input_dim = params.inputdim();
            output_channels = params.outputchannels();
            has_bias = params.hasbias();
            layer_type = "Embedding";
            break;
        }
        case Specification::NeuralNetworkLayer::LayerCase::kEmbeddingND: {
            const auto& params = layer.embeddingnd();
            input_dim = params.vocabsize();
            output_channels = params.embeddingsize();
            has_bias = params.hasbias();
            layer_type = "EmbeddingND";
            break;
        }
        default:
            return Result();
    }

    WeightParamType weightsValueType, biasValueType;
    weightsValueType = valueType(weights);
    biasValueType = valueType(bias);

    // Only float32 or float16 parameters can be populated at any time
    if ((weightsValueType == UNSPECIFIED) || (has_bias && biasValueType == UNSPECIFIED)){
        std::string err = layer_type + " '" + layer.name() + "' has invalid weights/bias fields. Field value types should match and should either be half or full precision.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (has_bias){
        if ((weightsValueType == CoreML::FLOAT16 && biasValueType == CoreML::FLOAT32) ||
            (weightsValueType == CoreML::FLOAT32 && biasValueType == CoreML::FLOAT16)){
            return Result(ResultType::INVALID_MODEL_PARAMETERS, layer_type + " layer '" + layer.name() +
                          "has unmatched precisions of weights/bias They should either be half or full precision.");
        }
    }
    // Validate weight and bias sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weights, input_dim * output_channels, output_channels,
                                                                  layer_type, layer.name(), "weight"));
    if (has_bias){
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(bias, output_channels, 1,
                                                                      layer_type, layer.name(), "bias"));
    }

    return Result();
}